

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::Internal::
     Evaluator<bsim::static_quad_value_bit_vector<41>,_bsim::static_quad_value_bit_vector<41>,_(Catch::Internal::Operator)0>
     ::evaluate(static_quad_value_bit_vector<41> *lhs,static_quad_value_bit_vector<41> *rhs)

{
  bool bVar1;
  static_quad_value_bit_vector<41> *b;
  static_quad_value_bit_vector<41> *in_RSI;
  static_quad_value_bit_vector<41> *in_RDI;
  
  b = opCast<bsim::static_quad_value_bit_vector<41>>(in_RDI);
  opCast<bsim::static_quad_value_bit_vector<41>>(in_RSI);
  bVar1 = bsim::operator==(in_RSI,b);
  return bVar1;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }